

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertForCygwin.cpp
# Opt level: O3

string * __thiscall
ApprovalTests::DoNothing::convertProgramForCygwin
          (string *__return_storage_ptr__,DoNothing *this,string *filePath)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (filePath->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filePath->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string DoNothing::convertProgramForCygwin(const std::string& filePath)
    {
        return filePath;
    }